

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

int mbedtls_gcm_starts(mbedtls_gcm_context *ctx,int mode,uchar *iv,size_t iv_len)

{
  uchar *x;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t olen;
  size_t local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_40 = 0;
  iVar4 = -0x14;
  if (iv_len - 1 < 0x1fffffffffffffff) {
    x = ctx->y;
    ctx->buf[0] = '\0';
    ctx->buf[1] = '\0';
    ctx->buf[2] = '\0';
    ctx->buf[3] = '\0';
    ctx->buf[4] = '\0';
    ctx->buf[5] = '\0';
    ctx->buf[6] = '\0';
    ctx->buf[7] = '\0';
    ctx->buf[8] = '\0';
    ctx->buf[9] = '\0';
    ctx->buf[10] = '\0';
    ctx->buf[0xb] = '\0';
    ctx->buf[0xc] = '\0';
    ctx->buf[0xd] = '\0';
    ctx->buf[0xe] = '\0';
    ctx->buf[0xf] = '\0';
    ctx->y[0] = '\0';
    ctx->y[1] = '\0';
    ctx->y[2] = '\0';
    ctx->y[3] = '\0';
    ctx->y[4] = '\0';
    ctx->y[5] = '\0';
    ctx->y[6] = '\0';
    ctx->y[7] = '\0';
    ctx->y[8] = '\0';
    ctx->y[9] = '\0';
    ctx->y[10] = '\0';
    ctx->y[0xb] = '\0';
    ctx->y[0xc] = '\0';
    ctx->y[0xd] = '\0';
    ctx->y[0xe] = '\0';
    ctx->y[0xf] = '\0';
    ctx->mode = (uchar)mode;
    ctx->len = 0;
    ctx->add_len = 0;
    if (iv_len == 0xc) {
      *(undefined4 *)(ctx->y + 8) = *(undefined4 *)(iv + 8);
      *(undefined8 *)x = *(undefined8 *)iv;
      ctx->y[0xf] = '\x01';
    }
    else {
      uVar8 = iv_len * 8;
      uStack_30 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | iv_len << 0x3b;
      local_38 = 0;
      if (iv_len != 0) {
        do {
          uVar8 = 0x10;
          if (iv_len < 0x10) {
            uVar8 = iv_len;
          }
          if (iv_len < 8) {
            uVar5 = 0;
          }
          else {
            uVar6 = 0;
            do {
              *(ulong *)(x + uVar6) = *(ulong *)(x + uVar6) ^ *(ulong *)(iv + uVar6);
              uVar5 = uVar6 + 8;
              uVar7 = uVar6 + 0x10;
              uVar6 = uVar5;
            } while (uVar7 <= uVar8);
          }
          if (uVar5 < uVar8) {
            do {
              x[uVar5] = x[uVar5] ^ iv[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
          gcm_mult(ctx,x,x);
          iv = iv + uVar8;
          iv_len = iv_len - uVar8;
        } while (iv_len != 0);
      }
      uVar1 = *(uint *)(ctx->y + 4);
      uVar2 = *(uint *)(ctx->y + 8);
      uVar3 = *(uint *)(ctx->y + 0xc);
      *(uint *)ctx->y = (uint)local_38 ^ *(uint *)ctx->y;
      *(uint *)(ctx->y + 4) = local_38._4_4_ ^ uVar1;
      *(uint *)(ctx->y + 8) = (uint)uStack_30 ^ uVar2;
      *(uint *)(ctx->y + 0xc) = uStack_30._4_4_ ^ uVar3;
      gcm_mult(ctx,x,x);
    }
    iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,x,0x10,ctx->base_ectr,&local_40);
  }
  return iVar4;
}

Assistant:

int mbedtls_gcm_starts(mbedtls_gcm_context *ctx,
                       int mode,
                       const unsigned char *iv, size_t iv_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char work_buf[16];
    const unsigned char *p;
    size_t use_len;
    uint64_t iv_bits;
#if !defined(MBEDTLS_BLOCK_CIPHER_C)
    size_t olen = 0;
#endif

    /* IV is limited to 2^64 bits, so 2^61 bytes */
    /* IV is not allowed to be zero length */
    if (iv_len == 0 || (uint64_t) iv_len >> 61 != 0) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    memset(ctx->y, 0x00, sizeof(ctx->y));
    memset(ctx->buf, 0x00, sizeof(ctx->buf));

    ctx->mode = mode;
    ctx->len = 0;
    ctx->add_len = 0;

    if (iv_len == 12) {
        memcpy(ctx->y, iv, iv_len);
        ctx->y[15] = 1;
    } else {
        memset(work_buf, 0x00, 16);
        iv_bits = (uint64_t) iv_len * 8;
        MBEDTLS_PUT_UINT64_BE(iv_bits, work_buf, 8);

        p = iv;
        while (iv_len > 0) {
            use_len = (iv_len < 16) ? iv_len : 16;

#if defined(MBEDTLS_COMPILER_IS_GCC) && (MBEDTLS_GCC_VERSION >= 70110)
#pragma GCC diagnostic push
#pragma GCC diagnostic warning "-Wstringop-overflow=0"
#endif

            mbedtls_xor(ctx->y, ctx->y, p, use_len);

#if defined(MBEDTLS_COMPILER_IS_GCC) && (MBEDTLS_GCC_VERSION >= 70110)
#pragma GCC diagnostic pop
#endif

            gcm_mult(ctx, ctx->y, ctx->y);

            iv_len -= use_len;
            p += use_len;
        }

        mbedtls_xor(ctx->y, ctx->y, work_buf, 16);

        gcm_mult(ctx, ctx->y, ctx->y);
    }


#if defined(MBEDTLS_BLOCK_CIPHER_C)
    ret = mbedtls_block_cipher_encrypt(&ctx->block_cipher_ctx, ctx->y, ctx->base_ectr);
#else
    ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ctx->base_ectr, &olen);
#endif
    if (ret != 0) {
        return ret;
    }

    return 0;
}